

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::removeOrderImpl(PatternModel *this,int at)

{
  int iVar1;
  Order *this_00;
  Editor editor;
  
  this_00 = order(this);
  Module::edit((Module *)&editor);
  iVar1 = trackerboy::Order::size(this_00);
  if (iVar1 + -1 == at) {
    aboutToRemoveLastPattern(this);
  }
  trackerboy::Order::remove(this_00,(char *)(ulong)(uint)at);
  QMutexLocker<QMutex>::unlock(&editor.super_QMutexLocker<QMutex>);
  iVar1 = trackerboy::Order::size(this_00);
  if (this->mCursorPattern < iVar1) {
    invalidate(this,at,true);
  }
  else {
    setCursorPattern(this,iVar1 + -1);
  }
  patternCountChanged(this,iVar1);
  return;
}

Assistant:

void PatternModel::removeOrderImpl(int at) {
    auto &_order = order();
    {
        auto editor = mModule.edit();
        if (at == _order.size() - 1) {
            emit aboutToRemoveLastPattern();
        }
        _order.remove(at);
    }

    auto count = _order.size();
    if (mCursorPattern >= count) {
        setCursorPattern(count - 1);
    } else {
        invalidate(at, true);
    }
    emit patternCountChanged(count);
}